

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

TriggerPrg * getRowTrigger(Parse *pParse,Trigger *pTrigger,Table *pTab,int orconf)

{
  TriggerPrg **ppTVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  byte bVar4;
  sqlite3 *db;
  sqlite3 *db_00;
  Vdbe *p;
  TriggerStep *pStep;
  VdbeOp *pVVar5;
  u8 uVar6;
  int iVar7;
  Parse *pPVar8;
  TriggerPrg *pTVar9;
  SubProgram *pSVar10;
  Parse *pParse_00;
  Vdbe *pVVar11;
  char *pcVar12;
  Expr *pEVar13;
  SrcList *pSVar14;
  ExprList *pEVar15;
  IdList *pColumn;
  ExprList *pSet;
  Expr *pWhere;
  Upsert *pUVar16;
  Select *pSVar17;
  TriggerPrg **ppTVar18;
  Expr *in_R8;
  TriggerStep **ppTVar19;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  Upsert *in_stack_ffffffffffffff00;
  int local_f4;
  undefined1 local_88 [20];
  undefined4 local_74;
  undefined1 local_68 [24];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  pPVar8 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar8 = pParse;
  }
  ppTVar1 = &pPVar8->pTriggerPrg;
  ppTVar18 = ppTVar1;
  while( true ) {
    pTVar9 = *ppTVar18;
    if (pTVar9 == (TriggerPrg *)0x0) {
      db = pParse->db;
      pTVar9 = (TriggerPrg *)sqlite3DbMallocZero(db,0x28);
      if (pTVar9 != (TriggerPrg *)0x0) {
        pTVar9->pNext = *ppTVar1;
        *ppTVar1 = pTVar9;
        pSVar10 = (SubProgram *)sqlite3DbMallocZero(db,0x30);
        pTVar9->pProgram = pSVar10;
        if (pSVar10 != (SubProgram *)0x0) {
          pVVar11 = pPVar8->pVdbe;
          pSVar10->pNext = pVVar11->pProgram;
          pVVar11->pProgram = pSVar10;
          pTVar9->pTrigger = pTrigger;
          pTVar9->orconf = orconf;
          pTVar9->aColmask[0] = 0xffffffff;
          pTVar9->aColmask[1] = 0xffffffff;
          pParse_00 = (Parse *)sqlite3DbMallocZero(db,0x1a0);
          if (pParse_00 != (Parse *)0x0) {
            local_40 = (undefined1  [16])0x0;
            local_50 = (undefined1  [16])0x0;
            local_68._8_16_ = (undefined1  [16])0x0;
            pParse_00->db = db;
            pParse_00->pTriggerTab = pTab;
            pParse_00->pToplevel = pPVar8;
            pParse_00->zAuthContext = pTrigger->zName;
            pParse_00->eTriggerOp = pTrigger->op;
            pParse_00->nQueryLoop = pParse->nQueryLoop;
            pParse_00->disableVtab = pParse->disableVtab;
            local_68._0_8_ = pParse_00;
            pVVar11 = sqlite3GetVdbe(pParse_00);
            if (pVVar11 != (Vdbe *)0x0) {
              if (pTrigger->zName != (char *)0x0) {
                pcVar12 = sqlite3MPrintf(db,"-- TRIGGER %s");
                sqlite3VdbeChangeP4(pVVar11,-1,pcVar12,-7);
              }
              if (pTrigger->pWhen == (Expr *)0x0) {
                local_f4 = 0;
              }
              else {
                local_f4 = 0;
                pEVar13 = sqlite3ExprDup(db,pTrigger->pWhen,0);
                iVar7 = sqlite3ResolveExprNames((NameContext *)local_68,pEVar13);
                if ((iVar7 == 0) && (db->mallocFailed == '\0')) {
                  local_f4 = pParse_00->nLabel + -1;
                  pParse_00->nLabel = local_f4;
                  sqlite3ExprIfFalse(pParse_00,pEVar13,local_f4,0x10);
                }
                sqlite3ExprDelete(db,pEVar13);
              }
              db_00 = pParse_00->db;
              p = pParse_00->pVdbe;
              ppTVar19 = &pTrigger->step_list;
              while (pStep = *ppTVar19, pStep != (TriggerStep *)0x0) {
                pEVar15 = (ExprList *)(ulong)(uint)orconf;
                uVar6 = (u8)orconf;
                if (orconf == 0xb) {
                  uVar6 = pStep->orconf;
                }
                pParse_00->eOrconf = uVar6;
                if (pStep->zSpan != (char *)0x0) {
                  pcVar12 = sqlite3MPrintf(db_00,"-- %s");
                  in_stack_fffffffffffffef8 = 0xfffffff9;
                  pEVar15 = (ExprList *)0x1;
                  in_R8 = (Expr *)0x0;
                  sqlite3VdbeAddOp4(p,0xa8,0x7fffffff,1,0,pcVar12,-7);
                }
                uVar6 = pStep->op;
                if (uVar6 == 'x') {
                  pSVar14 = targetSrcList(pParse_00,pStep);
                  pSVar17 = sqlite3SelectDup(db_00,pStep->pSelect,0);
                  pColumn = sqlite3IdListDup(db_00,pStep->pIdList);
                  bVar4 = pParse_00->eOrconf;
                  pUVar16 = pStep->pUpsert;
                  if (pUVar16 == (Upsert *)0x0) {
                    pUVar16 = (Upsert *)0x0;
                  }
                  else {
                    pEVar15 = sqlite3ExprListDup(db_00,pUVar16->pUpsertTarget,0);
                    pEVar13 = sqlite3ExprDup(db_00,pUVar16->pUpsertTargetWhere,0);
                    pSet = sqlite3ExprListDup(db_00,pUVar16->pUpsertSet,0);
                    pWhere = sqlite3ExprDup(db_00,pUVar16->pUpsertWhere,0);
                    pUVar16 = sqlite3UpsertNew(db_00,pEVar15,pEVar13,pSet,pWhere);
                  }
                  in_R8 = (Expr *)(ulong)bVar4;
                  sqlite3Insert(pParse_00,pSVar14,pSVar17,pColumn,(uint)bVar4,pUVar16);
                }
                else if (uVar6 == 'y') {
                  pSVar14 = targetSrcList(pParse_00,pStep);
                  pEVar13 = sqlite3ExprDup(db_00,pStep->pWhere,0);
                  sqlite3DeleteFrom(pParse_00,pSVar14,pEVar13,pEVar15,in_R8);
                }
                else if (uVar6 == 'z') {
                  pSVar14 = targetSrcList(pParse_00,pStep);
                  pEVar15 = sqlite3ExprListDup(db_00,pStep->pExprList,0);
                  pEVar13 = sqlite3ExprDup(db_00,pStep->pWhere,0);
                  in_R8 = (Expr *)(ulong)pParse_00->eOrconf;
                  sqlite3Update(pParse_00,pSVar14,pEVar15,pEVar13,(uint)pParse_00->eOrconf,
                                (ExprList *)0x0,
                                (Expr *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8
                                                ),in_stack_ffffffffffffff00);
                }
                else {
                  pSVar17 = sqlite3SelectDup(db_00,pStep->pSelect,0);
                  local_88[0] = '\x04';
                  local_88._4_16_ = (undefined1  [16])0x0;
                  local_74 = 0;
                  sqlite3Select(pParse_00,pSVar17,(SelectDest *)local_88);
                  sqlite3SelectDelete(db_00,pSVar17);
                }
                if (pStep->op != 0x83) {
                  sqlite3VdbeAddOp0(p,0x7c);
                }
                ppTVar19 = &pStep->pNext;
              }
              if (local_f4 != 0) {
                sqlite3VdbeResolveLabel(pVVar11,local_f4);
              }
              sqlite3VdbeAddOp0(pVVar11,0x45);
              if (pParse->nErr == 0) {
                pParse->zErrMsg = pParse_00->zErrMsg;
                pParse->nErr = pParse_00->nErr;
                pParse->rc = pParse_00->rc;
              }
              else {
                sqlite3DbFree(pParse_00->db,pParse_00->zErrMsg);
              }
              if ((db->mallocFailed == '\0') && (pParse->nErr == 0)) {
                pVVar5 = pVVar11->aOp;
                resolveP2Values(pVVar11,&pPVar8->nMaxArg);
                pSVar10->nOp = pVVar11->nOp;
                pVVar11->aOp = (Op *)0x0;
                pSVar10->aOp = pVVar5;
              }
              uVar2 = pParse_00->nTab;
              uVar3 = pParse_00->nMem;
              pSVar10->nMem = uVar3;
              pSVar10->nCsr = uVar2;
              pSVar10->token = pTrigger;
              pTVar9->aColmask[0] = pParse_00->oldmask;
              pTVar9->aColmask[1] = pParse_00->newmask;
              sqlite3VdbeDelete(pVVar11);
            }
            sqlite3ParserReset(pParse_00);
            sqlite3DbFreeNN(db,pParse_00);
            return pTVar9;
          }
        }
      }
      return (TriggerPrg *)0x0;
    }
    if ((pTVar9->pTrigger == pTrigger) && (pTVar9->orconf == orconf)) break;
    ppTVar18 = &pTVar9->pNext;
  }
  return pTVar9;
}

Assistant:

static TriggerPrg *getRowTrigger(
  Parse *pParse,       /* Current parse context */
  Trigger *pTrigger,   /* Trigger to code */
  Table *pTab,         /* The table trigger pTrigger is attached to */
  int orconf           /* ON CONFLICT algorithm. */
){
  Parse *pRoot = sqlite3ParseToplevel(pParse);
  TriggerPrg *pPrg;

  assert( pTrigger->zName==0 || pTab==tableOfTrigger(pTrigger) );

  /* It may be that this trigger has already been coded (or is in the
  ** process of being coded). If this is the case, then an entry with
  ** a matching TriggerPrg.pTrigger field will be present somewhere
  ** in the Parse.pTriggerPrg list. Search for such an entry.  */
  for(pPrg=pRoot->pTriggerPrg; 
      pPrg && (pPrg->pTrigger!=pTrigger || pPrg->orconf!=orconf); 
      pPrg=pPrg->pNext
  );

  /* If an existing TriggerPrg could not be located, create a new one. */
  if( !pPrg ){
    pPrg = codeRowTrigger(pParse, pTrigger, pTab, orconf);
  }

  return pPrg;
}